

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parser.hpp
# Opt level: O1

void __thiscall
jsoncons::basic_json_parser<wchar_t,_std::allocator<char>_>::basic_json_parser
          (basic_json_parser<wchar_t,_std::allocator<char>_> *this,allocator<char> *temp_alloc)

{
  _Any_data local_138;
  code *local_128;
  code *local_120;
  undefined1 local_118 [48];
  basic_json_options_common<wchar_t> local_e8;
  
  local_e8.nan_to_num_._M_dataplus._M_p = (pointer)&local_e8.nan_to_num_.field_2;
  local_e8._8_2_ = local_e8._8_2_ & 0xfe00;
  local_e8.nan_to_num_._M_string_length = 0;
  local_e8.nan_to_num_.field_2._M_local_buf[0] = L'\0';
  local_e8.inf_to_num_._M_dataplus._M_p = (pointer)&local_e8.inf_to_num_.field_2;
  local_e8.inf_to_num_._M_string_length = 0;
  local_e8.inf_to_num_.field_2._M_local_buf[0] = L'\0';
  local_e8.neginf_to_num_._M_dataplus._M_p = (pointer)&local_e8.neginf_to_num_.field_2;
  local_e8.neginf_to_num_._M_string_length = 0;
  local_e8.neginf_to_num_.field_2._M_local_buf[0] = L'\0';
  local_e8.nan_to_str_._M_dataplus._M_p = (pointer)&local_e8.nan_to_str_.field_2;
  local_e8.nan_to_str_._M_string_length = 0;
  local_e8.nan_to_str_.field_2._M_local_buf[0] = L'\0';
  local_e8.inf_to_str_._M_dataplus._M_p = (pointer)&local_e8.inf_to_str_.field_2;
  local_e8.inf_to_str_._M_string_length = 0;
  local_e8.inf_to_str_.field_2._M_local_buf[0] = L'\0';
  local_e8.neginf_to_str_._M_dataplus._M_p = (pointer)&local_e8.neginf_to_str_.field_2;
  local_e8.neginf_to_str_._M_string_length = 0;
  local_e8.neginf_to_str_.field_2._M_local_buf[0] = L'\0';
  local_e8.max_nesting_depth_ = 0x400;
  local_118._0_8_ = basic_json_decode_options<wchar_t>::vtable + 0x18;
  local_e8._vptr_basic_json_options_common =
       (_func_int **)(basic_json_decode_options<wchar_t>::vtable + 0x40);
  local_118[8] = false;
  local_118[9] = true;
  local_118[10] = false;
  local_118._16_8_ = (void *)0x0;
  local_118._24_8_ = 0;
  local_118._40_8_ =
       std::
       _Function_handler<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&),_jsoncons::default_json_parsing>
       ::_M_invoke;
  local_118._32_8_ =
       std::
       _Function_handler<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&),_jsoncons::default_json_parsing>
       ::_M_manager;
  local_138._M_unused._M_object = (void *)0x0;
  local_138._8_8_ = 0;
  local_120 = std::
              _Function_handler<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&),_jsoncons::default_json_parsing>
              ::_M_invoke;
  local_128 = std::
              _Function_handler<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&),_jsoncons::default_json_parsing>
              ::_M_manager;
  basic_json_parser(this,(basic_json_decode_options<wchar_t> *)local_118,
                    (function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)> *)
                    &local_138,temp_alloc);
  if (local_128 != (code *)0x0) {
    (*local_128)(&local_138,&local_138,__destroy_functor);
  }
  local_118._0_8_ = basic_json_decode_options<wchar_t>::vtable + 0x18;
  local_e8._vptr_basic_json_options_common =
       (_func_int **)(basic_json_decode_options<wchar_t>::vtable + 0x40);
  if ((_Manager_type)local_118._32_8_ != (_Manager_type)0x0) {
    (*(code *)local_118._32_8_)
              ((_Any_data *)(local_118 + 0x10),(_Any_data *)(local_118 + 0x10),__destroy_functor);
  }
  basic_json_options_common<wchar_t>::~basic_json_options_common(&local_e8);
  return;
}

Assistant:

basic_json_parser(const TempAllocator& temp_alloc = TempAllocator())
        : basic_json_parser(basic_json_decode_options<char_type>(), default_json_parsing(), temp_alloc)
    {
    }